

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O2

bool P_CheckNodes(MapData *map,bool rebuilt,int buildtime)

{
  float fVar1;
  vertex_t *pvVar2;
  uint uVar3;
  uint uVar4;
  DWORD DVar5;
  undefined4 *__ptr;
  FILE *__s;
  size_t sVar6;
  int iVar7;
  line_t_conflict *plVar8;
  ulong uVar9;
  int k;
  long lVar10;
  int i_2;
  undefined7 in_register_00000031;
  bool bVar11;
  int i;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int j;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> polyspots;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> anchors;
  uLongf outlen;
  int local_180;
  char local_178 [8];
  int local_170;
  char local_168 [8];
  int local_160;
  undefined8 local_15c;
  undefined8 uStack_154;
  FNodeBuilder builder;
  
  if ((int)CONCAT71(in_register_00000031,rebuilt) == 0) {
    uVar12 = 0;
    bVar18 = P_CheckForGLNodes();
    if (!bVar18) {
      uVar9 = (ulong)(uint)numsubsectors;
      if (numsubsectors < 1) {
        uVar9 = uVar12;
      }
      for (; uVar9 * 0x30 - uVar12 != 0; uVar12 = uVar12 + 0x30) {
        *(undefined8 *)((long)&gamesubsectors->sector + uVar12) =
             **(undefined8 **)(*(long *)((long)&gamesubsectors->firstline + uVar12) + 0x10);
      }
      nodes = (node_t *)0x0;
      numnodes = 0;
      subsectors = (subsector_t *)0x0;
      numsubsectors = 0;
      if (segs != (seg_t *)0x0) {
        operator_delete__(segs);
      }
      segs = (seg_t *)0x0;
      numsegs = 0;
      bVar18 = P_LoadGLNodes(map);
      bVar11 = true;
      if (bVar18) goto LAB_00405856;
      uVar4 = I_FPSTime();
      polyspots.Array = (FPolyStart *)0x0;
      polyspots.Most = 0;
      polyspots.Count = 0;
      anchors.Array = (FPolyStart *)0x0;
      anchors.Most = 0;
      anchors.Count = 0;
      P_GetPolySpots(map,&polyspots,&anchors);
      outlen = (uLongf)vertexes;
      local_180 = numvertexes;
      local_178 = (char  [8])sides;
      local_170 = numsides;
      local_168 = (char  [8])lines;
      local_160 = numlines;
      local_15c._0_4_ = 0;
      local_15c._4_4_ = 0;
      uStack_154 = 0;
      FNodeBuilder::FLevel::FindMapBounds((FLevel *)&outlen);
      FNodeBuilder::FNodeBuilder(&builder,(FLevel *)&outlen,&polyspots,&anchors,true);
      if (vertexes != (vertex_t *)0x0) {
        operator_delete__(vertexes);
      }
      FNodeBuilder::Extract
                (&builder,&nodes,&numnodes,&segs,&glsegextras,&numsegs,&subsectors,&numsubsectors,
                 &vertexes,&numvertexes);
      uVar3 = I_FPSTime();
      buildtime = uVar3 - uVar4;
      uVar12 = 0x17e8e01;
      DPrintf(3,"BSP generation took %.3f sec (%d segs)\n",(double)(uint)buildtime * 0.001,
              (ulong)(uint)numsegs);
      FNodeBuilder::~FNodeBuilder(&builder);
      TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::~TArray(&anchors);
      TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::~TArray(&polyspots);
    }
  }
  else {
    uVar12 = 0;
  }
  bVar11 = SUB81(uVar12,0);
  if (((level.maptype == MAPTYPE_BUILD) || (gl_cachenodes.Value != true)) ||
     ((float)buildtime / 1000.0 < gl_cachetime.Value)) {
    DPrintf(3,"Not caching nodes (time = %f)\n",(double)((float)buildtime / 1000.0));
  }
  else {
    DPrintf(3,"Caching nodes\n");
    builder.VertexMap = (IVertexMap *)0x0;
    builder.OldVertexTable = (int *)0x0;
    WriteLong((MemFile *)&builder,0);
    WriteLong((MemFile *)&builder,numvertexes);
    lVar16 = 0;
    for (lVar13 = 0; lVar13 < numvertexes; lVar13 = lVar13 + 1) {
      WriteLong((MemFile *)&builder,
                SUB84(*(double *)((long)&(vertexes->p).X + lVar16) + 103079215104.0,0));
      WriteLong((MemFile *)&builder,
                SUB84(*(double *)((long)&(vertexes->p).Y + lVar16) + 103079215104.0,0));
      lVar16 = lVar16 + 0x10;
    }
    WriteLong((MemFile *)&builder,numsubsectors);
    lVar13 = 0x28;
    for (lVar16 = 0; lVar16 < numsubsectors; lVar16 = lVar16 + 1) {
      WriteLong((MemFile *)&builder,*(DWORD *)((long)&subsectors->sector + lVar13));
      lVar13 = lVar13 + 0x30;
    }
    WriteLong((MemFile *)&builder,numsegs);
    lVar17 = 0;
    lVar13 = 0;
    for (lVar16 = 0; lVar16 < numsegs; lVar16 = lVar16 + 1) {
      WriteLong((MemFile *)&builder,
                (DWORD)((ulong)(*(long *)((long)&segs->v1 + lVar13) - (long)vertexes) >> 4));
      if (glsegextras == (glsegextra_t *)0x0) {
        DVar5 = 0;
      }
      else {
        DVar5 = *(DWORD *)((long)&glsegextras->PartnerSeg + lVar17);
      }
      WriteLong((MemFile *)&builder,DVar5);
      lVar14 = *(long *)((long)&segs->linedef + lVar13);
      if (lVar14 == 0) {
        WriteLong((MemFile *)&builder,0xffffffff);
        bVar18 = false;
      }
      else {
        WriteLong((MemFile *)&builder,(DWORD)((lVar14 - (long)lines) / 0x98));
        bVar18 = *(long *)((long)&segs->sidedef + lVar13) !=
                 *(long *)(*(long *)((long)&segs->linedef + lVar13) + 0x48);
      }
      outlen = CONCAT71(outlen._1_7_,bVar18);
      TArray<unsigned_char,_unsigned_char>::Push
                ((TArray<unsigned_char,_unsigned_char> *)&builder,(uchar *)&outlen);
      lVar13 = lVar13 + 0x30;
      lVar17 = lVar17 + 0x10;
    }
    WriteLong((MemFile *)&builder,numnodes);
    lVar13 = 0x10;
    lVar16 = 0x38;
    for (lVar17 = 0; lVar17 < numnodes; lVar17 = lVar17 + 1) {
      WriteLong((MemFile *)&builder,nodes[lVar17].x);
      WriteLong((MemFile *)&builder,nodes[lVar17].y);
      WriteLong((MemFile *)&builder,nodes[lVar17].dx);
      WriteLong((MemFile *)&builder,nodes[lVar17].dy);
      lVar14 = lVar13;
      for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          fVar1 = *(float *)((long)&nodes->x + lVar10 * 4 + lVar14);
          uVar4 = TArray<unsigned_char,_unsigned_char>::Reserve
                            ((TArray<unsigned_char,_unsigned_char> *)&builder,2);
          iVar7 = (int)fVar1;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + (long)(int)uVar4) = (char)iVar7;
          *(char *)((long)&(builder.VertexMap)->_vptr_IVertexMap + (long)(int)uVar4 + 1) =
               (char)((uint)iVar7 >> 8);
        }
        lVar14 = lVar14 + 0x10;
      }
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        uVar12 = *(ulong *)((long)&nodes->x + lVar14 * 8 + lVar16);
        if ((uVar12 & 1) == 0) {
          DVar5 = (DWORD)((long)(uVar12 - (long)nodes) / 0x48);
        }
        else {
          DVar5 = (uint)((long)(~(ulong)subsectors + uVar12) / 0x30) | 0x80000000;
        }
        WriteLong((MemFile *)&builder,DVar5);
      }
      lVar13 = lVar13 + 0x48;
      lVar16 = lVar16 + 0x48;
    }
    outlen = (ulong)builder.OldVertexTable >> 0x20;
    lVar16 = (long)numlines;
    lVar13 = lVar16 * 8 + 0x1c;
    while( true ) {
      __ptr = (undefined4 *)operator_new__(outlen + lVar13);
      iVar7 = compress(__ptr + lVar16 * 2 + 7,&outlen,builder.VertexMap,builder.OldVertexTable._4_4_
                      );
      if (iVar7 != -5) break;
      operator_delete__(__ptr);
      outlen = outlen + 0x400;
    }
    *__ptr = 0x48434143;
    __ptr[1] = numlines;
    MapData::GetChecksum(map,(BYTE *)(__ptr + 2));
    pvVar2 = vertexes;
    uVar9 = 0;
    uVar12 = (ulong)(uint)numlines;
    if (numlines < 1) {
      uVar12 = uVar9;
    }
    auVar19._8_4_ = (int)vertexes;
    auVar19._0_8_ = vertexes;
    auVar19._12_4_ = (int)((ulong)vertexes >> 0x20);
    plVar8 = lines;
    for (; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      *(ulong *)(__ptr + uVar9 * 2 + 6) =
           CONCAT44((int)((ulong)((long)plVar8->v2 - auVar19._8_8_) >> 4),
                    (int)((ulong)((long)plVar8->v1 - (long)pvVar2) >> 4));
      plVar8 = plVar8 + 1;
    }
    (__ptr + lVar16 * 2 + 7)[-1] = 0x334c475a;
    CreateCacheName((MapData *)&polyspots,SUB81(map,0));
    __s = fopen((char *)polyspots.Array,"wb");
    if (__s == (FILE *)0x0) {
      Printf("Cannot open nodes file %s for writing\n",polyspots.Array);
    }
    else {
      sVar6 = fwrite(__ptr,lVar13 + outlen,1,__s);
      if (sVar6 != 1) {
        Printf("Error saving nodes to file %s\n",polyspots.Array);
      }
      fclose(__s);
    }
    operator_delete__(__ptr);
    FString::~FString((FString *)&polyspots);
    TArray<unsigned_char,_unsigned_char>::~TArray((TArray<unsigned_char,_unsigned_char> *)&builder);
  }
LAB_00405856:
  if (gamenodes == (node_t *)0x0) {
    gamenodes = nodes;
    numgamenodes = numnodes;
    gamesubsectors = subsectors;
    numgamesubsectors = numsubsectors;
  }
  return bVar11;
}

Assistant:

bool P_CheckNodes(MapData * map, bool rebuilt, int buildtime)
{
	bool ret = false;
	bool loaded = false;

	// If the map loading code has performed a node rebuild we don't need to check for it again.
	if (!rebuilt && !P_CheckForGLNodes())
	{
		ret = true;	// we are not using the level's original nodes if we get here.
		for (int i = 0; i < numsubsectors; i++)
		{
			gamesubsectors[i].sector = gamesubsectors[i].firstline->sidedef->sector;
		}

		nodes = NULL;
		numnodes = 0;
		subsectors = NULL;
		numsubsectors = 0;
		if (segs) delete [] segs;
		segs = NULL;
		numsegs = 0;

		// Try to load GL nodes (cached or GWA)
		loaded = P_LoadGLNodes(map);
		if (!loaded)
		{
			// none found - we have to build new ones!
			unsigned int startTime, endTime;

			startTime = I_FPSTime ();
			TArray<FNodeBuilder::FPolyStart> polyspots, anchors;
			P_GetPolySpots (map, polyspots, anchors);
			FNodeBuilder::FLevel leveldata =
			{
				vertexes, numvertexes,
				sides, numsides,
				lines, numlines,
				0, 0, 0, 0
			};
			leveldata.FindMapBounds ();
			FNodeBuilder builder (leveldata, polyspots, anchors, true);
			delete[] vertexes;
			builder.Extract (nodes, numnodes,
				segs, glsegextras, numsegs,
				subsectors, numsubsectors,
				vertexes, numvertexes);
			endTime = I_FPSTime ();
			DPrintf (DMSG_NOTIFY, "BSP generation took %.3f sec (%d segs)\n", (endTime - startTime) * 0.001, numsegs);
			buildtime = endTime - startTime;
		}
	}

	if (!loaded)
	{
#ifdef DEBUG
		// Building nodes in debug is much slower so let's cache them only if cachetime is 0
		buildtime = 0;
#endif
		if (level.maptype != MAPTYPE_BUILD && gl_cachenodes && buildtime/1000.f >= gl_cachetime)
		{
			DPrintf(DMSG_NOTIFY, "Caching nodes\n");
			CreateCachedNodes(map);
		}
		else
		{
			DPrintf(DMSG_NOTIFY, "Not caching nodes (time = %f)\n", buildtime/1000.f);
		}
	}

	if (!gamenodes)
	{
		gamenodes = nodes;
		numgamenodes = numnodes;
		gamesubsectors = subsectors;
		numgamesubsectors = numsubsectors;
	}
	return ret;
}